

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O1

void Eigen::internal::treePostorder<int,Eigen::Matrix<int,_1,1,0,_1,1>>
               (int n,Matrix<int,__1,_1,_0,__1,_1> *parent,Matrix<int,__1,_1,_0,__1,_1> *post)

{
  int iVar1;
  bool bVar2;
  DenseStorage<int,__1,__1,_1,_0> DVar3;
  undefined1 auVar4 [8];
  int *piVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  Index othersize;
  ulong uVar10;
  DenseStorage<int,__1,__1,_1,_0> local_58;
  undefined1 auStack_48 [8];
  Matrix<int,__1,_1,_0,__1,_1> first_kid;
  
  auStack_48 = (undefined1  [8])0x0;
  first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)0x0;
  DVar3 = _auStack_48;
  auStack_48 = (undefined1  [8])0x0;
  local_58.m_data = (int *)0x0;
  local_58.m_rows = 0;
  _auStack_48 = DVar3;
  if (n < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0x10c,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<int, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  iVar1 = n + 1;
  uVar10 = (ulong)iVar1;
  auVar4 = auStack_48;
  if (uVar10 != 0) {
    free((void *)0x0);
    if (iVar1 == 0) {
      auStack_48 = (undefined1  [8])0x0;
      auVar4 = auStack_48;
    }
    else {
      auVar4 = (undefined1  [8])malloc(uVar10 * 4);
      if (auVar4 == (undefined1  [8])0x0) goto LAB_0014d583;
    }
  }
  auStack_48 = auVar4;
  first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)uVar10;
  piVar5 = local_58.m_data;
  if (local_58.m_rows != uVar10) {
    free(local_58.m_data);
    if (iVar1 == 0) {
      local_58.m_data = (int *)0x0;
      piVar5 = local_58.m_data;
    }
    else {
      piVar5 = (int *)malloc(uVar10 * 4);
      if (piVar5 == (int *)0x0) {
LAB_0014d583:
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = std::streambuf::xsgetn;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_58.m_data = piVar5;
  uVar6 = uVar10 + 3;
  if (-1 < (long)uVar10) {
    uVar6 = uVar10;
  }
  local_58.m_rows = uVar10;
  if (2 < n) {
    lVar8 = 0;
    do {
      *(undefined1 (*) [16])(local_58.m_data + lVar8) = (undefined1  [16])0x0;
      lVar8 = lVar8 + 4;
    } while (lVar8 < (long)(uVar6 & 0xfffffffffffffffc));
  }
  if ((long)(uVar6 & 0xfffffffffffffffc) < (long)uVar10) {
    memset(local_58.m_data + ((long)uVar6 >> 2) * 4,0,uVar10 * 4 + ((long)uVar6 >> 2) * -0x10);
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,uVar10);
  uVar10 = (post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (-1 < (long)uVar10) {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,uVar10,1);
    uVar6 = (post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (uVar6 != uVar10) {
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                    ,0x1f2,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
                   );
    }
    uVar10 = uVar6 + 3;
    if (-1 < (long)uVar6) {
      uVar10 = uVar6;
    }
    if (3 < (long)uVar6) {
      lVar8 = 0;
      do {
        *(undefined1 (*) [16])
         ((post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data +
         lVar8) = (undefined1  [16])0x0;
        lVar8 = lVar8 + 4;
      } while (lVar8 < (long)(uVar10 & 0xfffffffffffffffc));
    }
    if ((long)(uVar10 & 0xfffffffffffffffc) < (long)uVar6) {
      memset((post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             ((long)uVar10 >> 2) * 4,0,uVar6 * 4 + ((long)uVar10 >> 2) * -0x10);
    }
    if (-1 < (long)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data) {
      if (3 < (long)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data) {
        uVar10 = 0;
        do {
          piVar5 = (int *)((long)auStack_48 + uVar10 * 4);
          *piVar5 = -1;
          piVar5[1] = -1;
          piVar5[2] = -1;
          piVar5[3] = -1;
          uVar10 = uVar10 + 4;
        } while (uVar10 < ((ulong)first_kid.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data & 0x7ffffffffffffffc));
      }
      if ((long)((ulong)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data & 0x7ffffffffffffffc) <
          (long)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_data) {
        memset((void *)(((long)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                               .m_storage.m_data << 2 & 0xfffffffffffffff0U) + (long)auStack_48),
               0xff,(ulong)((uint)((long)first_kid.
                                         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data << 2) & 0xc));
      }
      if (0 < n) {
        piVar5 = (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        lVar8 = (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
        uVar6 = (ulong)(uint)n;
        uVar10 = uVar6;
        do {
          if ((((lVar8 < (long)uVar6) || (lVar9 = (long)piVar5[uVar10 - 1], lVar9 < 0)) ||
              ((long)first_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                     .m_data <= lVar9)) || (local_58.m_rows < (long)uVar6)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x18a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                         );
          }
          local_58.m_data[uVar10 - 1] = *(int *)((long)auStack_48 + lVar9 * 4);
          *(int *)((long)auStack_48 + lVar9 * 4) = (int)uVar10 + -1;
          bVar2 = 1 < (long)uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar2);
      }
      nr_etdfs<int,Eigen::Matrix<int,_1,1,0,_1,1>>
                (n,parent,(Matrix<int,__1,_1,_0,__1,_1> *)auStack_48,
                 (Matrix<int,__1,_1,_0,__1,_1> *)&local_58,post,0);
      free(local_58.m_data);
      free((void *)auStack_48);
      return;
    }
  }
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
               );
}

Assistant:

void treePostorder(Index n, IndexVector& parent, IndexVector& post)
{
  IndexVector first_kid, next_kid; // Linked list of children 
  Index postnum; 
  // Allocate storage for working arrays and results 
  first_kid.resize(n+1); 
  next_kid.setZero(n+1);
  post.setZero(n+1);
  
  // Set up structure describing children
  Index v, dad; 
  first_kid.setConstant(-1); 
  for (v = n-1; v >= 0; v--) 
  {
    dad = parent(v);
    next_kid(v) = first_kid(dad); 
    first_kid(dad) = v; 
  }
  
  // Depth-first search from dummy root vertex #n
  postnum = 0; 
  internal::nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
}